

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O3

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::LineNumberOps,_void>::enumeration
               (IO *io,LineNumberOps *value)

{
  int iVar1;
  
  iVar1 = (*io->_vptr_IO[2])();
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_extended_op",(ulong)(*value == DW_LNS_extended_op & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_extended_op;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_LNS_copy",(ulong)(*value == DW_LNS_copy & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_copy;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_advance_pc",(ulong)(*value == DW_LNS_advance_pc & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_advance_pc;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_advance_line",(ulong)(*value == DW_LNS_advance_line & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_advance_line;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_set_file",(ulong)(*value == DW_LNS_set_file & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_file;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_set_column",(ulong)(*value == DW_LNS_set_column & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_column;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_negate_stmt",(ulong)(*value == DW_LNS_negate_stmt & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_negate_stmt;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_set_basic_block",
                     (ulong)(*value == DW_LNS_set_basic_block & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_basic_block;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_const_add_pc",(ulong)(*value == DW_LNS_const_add_pc & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_const_add_pc;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_fixed_advance_pc",
                     (ulong)(*value == DW_LNS_fixed_advance_pc & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_fixed_advance_pc;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_set_prologue_end",
                     (ulong)(*value == DW_LNS_set_prologue_end & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_prologue_end;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_LNS_set_epilogue_begin",
                     (ulong)(*value == DW_LNS_set_epilogue_begin & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_epilogue_begin;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_LNS_set_isa",(ulong)(*value == DW_LNS_set_isa & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_LNS_set_isa;
  }
  IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::LineNumberOps>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::LineNumberOps &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex8>(value);
  }